

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_signature.c
# Opt level: O1

signature signature_resize(signature s,size_t count)

{
  ulong uVar1;
  signature psVar2;
  set *ppsVar3;
  ulong uVar4;
  
  if (s != (signature)0x0) {
    psVar2 = (signature)realloc(s,count * 0x18 + 0x18);
    if (psVar2 == (signature)0x0) {
      psVar2 = (signature)0x0;
    }
    else {
      uVar1 = psVar2->count;
      if (uVar1 < count) {
        ppsVar3 = &psVar2[uVar1 + 1].map;
        uVar4 = uVar1;
        do {
          if (uVar4 < uVar1) {
            ((signature_type *)(ppsVar3 + -1))->ret = (type)0xffffffffffffffff;
            *ppsVar3 = (set)0x0;
            ppsVar3[1] = (set)0x0;
          }
          uVar4 = uVar4 + 1;
          ppsVar3 = ppsVar3 + 3;
        } while (count != uVar4);
      }
      psVar2->count = count;
    }
    return psVar2;
  }
  return (signature)0x0;
}

Assistant:

signature signature_resize(signature s, size_t count)
{
	signature new_s;
	size_t index;

	if (s == NULL)
	{
		return NULL;
	}

	new_s = realloc(s, sizeof(struct signature_type) + sizeof(struct signature_node_type) * count);

	if (new_s == NULL)
	{
		return NULL;
	}

	for (index = new_s->count; index < count; ++index)
	{
		signature_node node = signature_at(new_s, index);

		if (node != NULL)
		{
			node->index = REFLECT_SIGNATURE_INVALID_INDEX;
			node->name = NULL;
			node->t = NULL;
		}
	}

	new_s->count = count;

	return new_s;
}